

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_conncache_add_conn(Curl_easy *data)

{
  connectdata *conn;
  conncache *connc;
  conncache *h;
  long lVar1;
  connectbundle *p;
  size_t key_len;
  void *pvVar2;
  char **hostp;
  CURLcode CVar3;
  bool bVar4;
  char key [128];
  char local_b8 [136];
  
  conn = data->conn;
  connc = (data->state).conn_cache;
  CVar3 = CURLE_OK;
  hostp = (char **)0x0;
  p = Curl_conncache_find_bundle(data,conn,connc,(char **)0x0);
  if (p == (connectbundle *)0x0) {
    p = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (p == (connectbundle *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      p->num_connections = 0;
      p->multiuse = 0;
      Curl_llist_init(&p->conn_list,conn_llist_dtor);
      CVar3 = CURLE_OK;
    }
    if (p == (connectbundle *)0x0) {
      bVar4 = false;
    }
    else {
      hashkey(conn,local_b8,0,hostp);
      h = (data->state).conn_cache;
      key_len = strlen(local_b8);
      pvVar2 = Curl_hash_add(&h->hash,local_b8,key_len,p);
      bVar4 = pvVar2 != (void *)0x0;
      CVar3 = CURLE_OK;
      if (!bVar4) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      if (p != (connectbundle *)0x0 && !bVar4) {
        bVar4 = false;
        Curl_llist_destroy(&p->conn_list,(void *)0x0);
        (*Curl_cfree)(p);
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
    }
    if (!bVar4) goto LAB_0010e26b;
  }
  Curl_llist_insert_next(&p->conn_list,(p->conn_list).tail,conn,&conn->bundle_node);
  conn->bundle = p;
  p->num_connections = p->num_connections + 1;
  lVar1 = connc->next_connection_id;
  connc->next_connection_id = lVar1 + 1;
  conn->connection_id = lVar1;
  connc->num_conn = connc->num_conn + 1;
LAB_0010e26b:
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle = NULL;
  struct connectdata *conn = data->conn;
  struct conncache *connc = data->state.conn_cache;
  DEBUGASSERT(conn);

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(data, conn, data->state.conn_cache,
                                      NULL);
  if(!bundle) {
    int rc;
    char key[HASHKEY_SIZE];

    result = bundle_create(&bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key), NULL);
    rc = conncache_add_bundle(data->state.conn_cache, key, bundle);

    if(!rc) {
      bundle_destroy(bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(data, "Added connection %ld. "
               "The cache now contains %zu members",
               conn->connection_id, connc->num_conn));

  unlock:
  CONNCACHE_UNLOCK(data);

  return result;
}